

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerBase::PreventExtensions(PathTypeHandlerBase *this,DynamicObject *instance)

{
  code *pcVar1;
  DynamicObject *instance_00;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *pSVar4;
  DictionaryTypeHandler *pDVar5;
  PropertyRecord *operationInternalPropertyRecord;
  undefined4 *puVar6;
  ArrayObject *pAVar7;
  ArrayObject *objectArray;
  DynamicObject *pDStack_20;
  BOOL tempResult;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  pSVar4 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pSVar4->convertPathToDictionaryExtensionsCount =
       pSVar4->convertPathToDictionaryExtensionsCount + 1;
  bVar2 = CanConvertToSimpleDictionaryType(this);
  instance_00 = pDStack_20;
  if (bVar2) {
    operationInternalPropertyRecord =
         BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                   ((BuiltInPropertyRecord *)InternalPropertyRecords::NonExtensibleType);
    BVar3 = ConvertToSharedNonExtensibleTypeIfNeededAndCallOperation<Js::PathTypeHandlerBase::PreventExtensions(Js::DynamicObject*)::__0>
                      (this,instance_00,operationInternalPropertyRecord,
                       (anon_class_8_1_0902ba13)&stack0xffffffffffffffe0);
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x50a,"(tempResult)","tempResult");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    this_local._4_4_ = BVar3;
    if ((BVar3 != 0) &&
       (pAVar7 = DynamicObject::GetObjectArray(pDStack_20), pAVar7 != (ArrayObject *)0x0)) {
      (*(pAVar7->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x35])();
    }
  }
  else {
    pDVar5 = ConvertToDictionaryType(this,pDStack_20);
    this_local._4_4_ =
         (*(pDVar5->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x36])(pDVar5,pDStack_20);
  }
  return this_local._4_4_;
}

Assistant:

BOOL PathTypeHandlerBase::PreventExtensions(DynamicObject* instance)
    {
#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertPathToDictionaryExtensionsCount++;
#endif
        if (!CanConvertToSimpleDictionaryType())
        {
            return ConvertToDictionaryType(instance)->PreventExtensions(instance);
        }

        BOOL tempResult = this->ConvertToSharedNonExtensibleTypeIfNeededAndCallOperation(instance, InternalPropertyRecords::NonExtensibleType,
            [&](SimpleDictionaryTypeHandlerWithNonExtensibleSupport* newTypeHandler)
            {
                return newTypeHandler->PreventExtensionsInternal(instance);
            });

        Assert(tempResult);
        if (tempResult)
        {
            // Call preventExtensions on the objectArray -- which will create different type for array type handler.
            ArrayObject * objectArray = instance->GetObjectArray();
            if (objectArray)
            {
                objectArray->PreventExtensions();
            }
        }

        return tempResult;
    }